

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O3

int inform_bin_step(double *series,size_t n,double step,int *binned,inform_error *err)

{
  double dVar1;
  inform_error iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (series != (double *)0x0) {
    if (n == 0) {
      iVar2 = INFORM_ESHORTSERIES;
      goto LAB_00108ca7;
    }
    if (step <= 2.220446049250313e-15) {
      iVar2 = INFORM_EBIN;
      goto LAB_00108ca7;
    }
    if (binned != (int *)0x0) {
      dVar7 = *series;
      dVar8 = dVar7;
      if (n != 1) {
        sVar5 = 1;
        do {
          dVar6 = series[sVar5];
          dVar1 = dVar6;
          if (dVar8 <= dVar6) {
            dVar1 = dVar8;
          }
          dVar8 = dVar1;
          if (dVar6 <= dVar7) {
            dVar6 = dVar7;
          }
          dVar7 = dVar6;
          sVar5 = sVar5 + 1;
        } while (n != sVar5);
      }
      dVar6 = ceil((dVar7 - dVar8) / step);
      dVar7 = fmod(dVar7 - dVar8,step);
      iVar4 = (int)dVar6 + (uint)(dVar7 == 0.0);
      sVar5 = 0;
      while( true ) {
        dVar7 = floor((series[sVar5] - dVar8) / step);
        iVar3 = (int)dVar7;
        binned[sVar5] = iVar3;
        if ((iVar3 < 0) || (iVar4 <= iVar3)) break;
        sVar5 = sVar5 + 1;
        if (n == sVar5) {
          return iVar4;
        }
      }
      __assert_fail("0 <= binned[i] && binned[i] < b",
                    "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/src/utilities/binning.c"
                    ,0x51,
                    "int inform_bin_step(const double *, size_t, double, int *, inform_error *)");
    }
  }
  iVar2 = INFORM_ETIMESERIES;
LAB_00108ca7:
  if (err != (inform_error *)0x0) {
    *err = iVar2;
  }
  return 0;
}

Assistant:

int inform_bin_step(double const *series, size_t n, double step, int *binned,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (step <= 10.*DBL_EPSILON)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    double min, max;
    double range = inform_range(series, n, &min, &max, err);
    int b = (int) ceil(range / step);

    if (fmod(range,step) == 0.0) ++b;

    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int) floor((series[i] - min) / step);
        assert(0 <= binned[i] && binned[i] < b);
    }

    return b;
}